

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::IsnanCase::IsnanCase
          (IsnanCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *name;
  DataType local_174;
  VarType local_150;
  allocator<char> local_131;
  string local_130;
  Symbol local_110;
  VarType local_d8;
  allocator<char> local_b9;
  string local_b8;
  Symbol local_98;
  DataType local_5c;
  int local_58;
  DataType boolType;
  int vecSize;
  string local_48;
  ShaderType local_24;
  Precision local_20;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  Context *context_local;
  IsnanCase *this_local;
  
  local_24 = shaderType;
  local_20 = precision;
  shaderType_local = baseType;
  _precision_local = context;
  context_local = (Context *)this;
  getCommonFuncCaseName_abi_cxx11_
            (&local_48,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  name = (char *)std::__cxx11::string::c_str();
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,context,name,"isnan",local_24);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IsnanCase_011c30f0;
  local_58 = glu::getDataTypeScalarSize(shaderType_local);
  if (local_58 < 2) {
    local_174 = TYPE_BOOL;
  }
  else {
    local_174 = glu::getDataTypeBoolVec(local_58);
  }
  local_5c = local_174;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"in0",&local_b9);
  glu::VarType::VarType(&local_d8,shaderType_local,local_20);
  gls::ShaderExecUtil::Symbol::Symbol(&local_98,&local_b8,&local_d8);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_CommonFunctionCase).m_spec.inputs,&local_98);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_98);
  glu::VarType::~VarType(&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"out0",&local_131);
  glu::VarType::VarType(&local_150,local_5c,PRECISION_LAST);
  gls::ShaderExecUtil::Symbol::Symbol(&local_110,&local_130,&local_150);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_CommonFunctionCase).m_spec.outputs,&local_110);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_110);
  glu::VarType::~VarType(&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::operator=
            ((string *)&(this->super_CommonFunctionCase).m_spec.source,"out0 = isnan(in0);");
  return;
}

Assistant:

IsnanCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "isnan", shaderType)
	{
		DE_ASSERT(glu::isDataTypeFloatOrVec(baseType));

		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	boolType	= vecSize > 1 ? glu::getDataTypeBoolVec(vecSize) : glu::TYPE_BOOL;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(boolType, glu::PRECISION_LAST)));
		m_spec.source = "out0 = isnan(in0);";
	}